

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O3

void GenCodeCmdSetRange(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  char *pcVar1;
  int iVar2;
  code *pcVar3;
  uchar uVar4;
  uint uVar5;
  ulong in_RAX;
  char *pcVar6;
  char cVar7;
  x86Size size;
  ulong uVar8;
  long lVar9;
  long lVar10;
  uint shift;
  x86Command xVar11;
  ulong unaff_RBP;
  x86Reg in_R8D;
  uint in_R9D;
  uint shift_00;
  long unaff_R12;
  uint *unaff_R13;
  uint *unaff_R15;
  longdouble in_ST0;
  RegVmCmd RStack_30;
  undefined8 uStack_28;
  
  if (5 < cmd.rB) {
    RStack_30 = (RegVmCmd)GenCodeCmdMemCopy;
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGenRegVm_X86.cpp"
                  ,0x614,"void GenCodeCmdSetRange(CodeGenRegVmContext &, RegVmCmd)");
  }
  pcVar6 = (char *)((ulong)cmd >> 8);
  uVar8 = (ulong)cmd >> 0x10 & 0xff;
  lVar9 = (long)(int)(&switchD_002a8e42::switchdataD_00366210)[uVar8];
  lVar10 = (long)&switchD_002a8e42::switchdataD_00366210 + lVar9;
  uVar4 = cmd.rA;
  cVar7 = (char)((ulong)ctx >> 8);
  shift = (uint)unaff_RBP;
  size = (x86Size)lVar10;
  xVar11 = cmd._0_4_;
  shift_00 = (uint)unaff_R12;
  uVar5 = cmd._1_4_;
  uStack_28 = in_RAX;
  switch(uVar8) {
  default:
    RStack_30.code = 'i';
    RStack_30.rA = 0x8e;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rEBX,(uVar5 & 0xff) << 3);
    xVar11 = o_rep_stosq;
    break;
  case 1:
    RStack_30.code = 0xc4;
    RStack_30.rA = 0x8e;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_REG_RPTR(&ctx->ctx,o_cvtsd2ss,rXMM0,sQWORD,rEBX,(uVar5 & 0xff) << 3);
    RStack_30.code = 0xd8;
    RStack_30.rA = 0x8e;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_REG_REG(&ctx->ctx,o_movd,rEAX,rXMM0);
    goto LAB_002a8eff;
  case 3:
    RStack_30.code = 0xff;
    RStack_30.rA = 0x8e;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,(uVar5 & 0xff) << 3);
LAB_002a8eff:
    xVar11 = o_rep_stosd;
    break;
  case 4:
    RStack_30.code = 0x98;
    RStack_30.rA = 0x8e;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,(uVar5 & 0xff) << 3);
    xVar11 = o_rep_stosw;
    break;
  case 5:
    RStack_30.code = '+';
    RStack_30.rA = 0x8f;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,(uVar5 & 0xff) << 3);
    xVar11 = o_rep_stosb;
    break;
  case 6:
    pcVar3 = (code *)swi(3);
    (*pcVar3)();
    return;
  case 7:
    UINT_00366214._0_1_ = cVar7 + -0x6e;
    RStack_30.code = 0xc3;
    RStack_30.rA = 0x96;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_RPTR_NUM(&ctx->ctx,xVar11,0x366210,rEBP,shift,in_R9D);
    ctx = (CodeGenRegVmContext *)&(ctx->ctx).x86Base;
    goto LAB_002a9809;
  case 8:
    pcVar6 = (char *)(lVar9 + 0x366207 + lVar10 * 4);
    *pcVar6 = *pcVar6 + (char)lVar10;
    RStack_30.code = 0x85;
    RStack_30.rA = 0x97;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rESI,rR15);
    ctx = (CodeGenRegVmContext *)&(ctx->ctx).x86LookBehind;
    RStack_30.code = 0xc1;
    RStack_30.rA = 0x97;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_REG_NUM((CodeGenGenericContext *)cmd,o_add64,rESI,(uint)unaff_R15);
    RStack_30.code = 0xe1;
    RStack_30.rA = 0x97;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_REG_RPTR((CodeGenGenericContext *)cmd,o_lea,rEDI,sQWORD,rEBP,shift);
    RStack_30.code = 0xf9;
    RStack_30.rA = 0x97;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_REG_NUM((CodeGenGenericContext *)cmd,o_mov,rECX,
                    (uint)((ulong)unaff_R13 >> 2) & 0x3fffffff);
    RStack_30.code = '\x06';
    RStack_30.rA = 0x98;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP((CodeGenGenericContext *)cmd,o_rep_movsd);
    goto LAB_002a9809;
  case 9:
    *pcVar6 = *pcVar6 + uVar4;
    pcVar6 = (char *)((long)&UINT_00366214 + lVar9 + 3);
    *pcVar6 = *pcVar6 + cVar7;
    RStack_30 = (RegVmCmd)&LAB_002a9698;
    EMIT_OP_RPTR_NUM(&ctx->ctx,xVar11,0x366210,size,shift,in_R9D);
    goto LAB_002a9809;
  case 10:
    *pcVar6 = *pcVar6 + uVar4;
    pcVar6 = (char *)((long)&UINT_00366214 + lVar9 + 3);
    *pcVar6 = *pcVar6 + cVar7;
    RStack_30.code = '3';
    RStack_30.rA = 0x96;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_RPTR_REG(&ctx->ctx,xVar11,0x366210,size,shift,rEAX);
LAB_002a9809:
    while( true ) {
      iVar2 = *(int *)&(ctx->ctx).x86Op;
      if (iVar2 == 1) {
        RStack_30.code = '7';
        RStack_30.rA = 0x98;
        RStack_30.rB = '*';
        RStack_30.rC = '\0';
        RStack_30.argument = 0;
        EMIT_OP_REG_RPTR((CodeGenGenericContext *)cmd,o_mov64,rEDX,sQWORD,rR13,0x120);
        RStack_30.code = '[';
        RStack_30.rA = 0x98;
        RStack_30.rB = '*';
        RStack_30.rC = '\0';
        RStack_30.argument = 0;
        EMIT_OP_RPTR_NUM((CodeGenGenericContext *)cmd,o_mov,sDWORD,rEDX,0,
                         *(int *)((long)cmd + 0xa20) + 1);
        RStack_30.code = '~';
        RStack_30.rA = 0x98;
        RStack_30.rB = '*';
        RStack_30.rC = '\0';
        RStack_30.argument = 0;
        EMIT_OP_RPTR_NUM((CodeGenGenericContext *)cmd,o_add64,sQWORD,rR13,0x120,4);
        return;
      }
      uVar5 = iVar2 - 2;
      if (uVar5 < 5) break;
      ctx = (CodeGenRegVmContext *)((long)&(ctx->ctx).x86Op + 4);
    }
    (*(code *)(*(int *)(unaff_R12 + (ulong)uVar5 * 4) + unaff_R12))();
    return;
  case 0xb:
    if (uVar5 != 7) {
      unaff_R13 = &switchD_002aa3f2::switchdataD_0036623c;
      uStack_28._4_4_ = (uint)(in_RAX >> 0x20);
      uStack_28 = CONCAT44(uStack_28._4_4_,shift);
      do {
        uVar5 = (int)pcVar6 - 2;
        if (uVar5 < 5) {
          (*(code *)((long)(int)unaff_R13[uVar5] + (long)unaff_R13))();
          return;
        }
        unaff_R15 = unaff_R15 + 1;
LAB_002aa5da:
        pcVar6 = (char *)(ulong)*unaff_R15;
      } while (*unaff_R15 != 7);
    }
    if (cmd.rC != '\0') {
      RStack_30.code = '\b';
      RStack_30.rA = 0xa6;
      RStack_30.rB = '*';
      RStack_30.rC = '\0';
      RStack_30.argument = 0;
      EMIT_OP_REG_NUM64(&ctx->ctx,o_mov64,rEDI,(unsigned_long_long)ctx->vmState);
      RStack_30.code = '\x1f';
      RStack_30.rA = 0xa6;
      RStack_30.rB = '*';
      RStack_30.rC = '\0';
      RStack_30.argument = 0;
      EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rESI,rR15);
      RStack_30.code = '5';
      RStack_30.rA = 0xa6;
      RStack_30.rB = '*';
      RStack_30.rC = '\0';
      RStack_30.argument = 0;
      EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rEDX,uStack_28._4_4_);
      RStack_30.code = 'B';
      RStack_30.rA = 0xa6;
      RStack_30.rB = '*';
      RStack_30.rC = '\0';
      RStack_30.argument = 0;
      EMIT_REG_READ(&ctx->ctx,rESI);
      RStack_30.code = 'O';
      RStack_30.rA = 0xa6;
      RStack_30.rB = '*';
      RStack_30.rC = '\0';
      RStack_30.argument = 0;
      EMIT_REG_READ(&ctx->ctx,rEDX);
      RStack_30.code = 'l';
      RStack_30.rA = 0xa6;
      RStack_30.rB = '*';
      RStack_30.rC = '\0';
      RStack_30.argument = 0;
      EMIT_OP_RPTR(&ctx->ctx,o_call,sQWORD,rEDI,0xd8);
    }
    RStack_30.code = 0x81;
    RStack_30.rA = 0xa6;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
              (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
    RStack_30.code = 0x96;
    RStack_30.rA = 0xa6;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    CodeGenGenericContext::KillLateUnreadRegVmRegisters
              (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
    RStack_30.code = 0xaa;
    RStack_30.rA = 0xa6;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rEAX,(uint)unaff_RBP);
    RStack_30.code = 0xc1;
    RStack_30.rA = 0xa6;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_REG_NUM(&ctx->ctx,o_add64,rESP,0x28);
    RStack_30.code = 0xd3;
    RStack_30.rA = 0xa6;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_REG(&ctx->ctx,o_pop,rR15);
    RStack_30.code = 0xe5;
    RStack_30.rA = 0xa6;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_REG(&ctx->ctx,o_pop,rEBX);
    EMIT_OP(&ctx->ctx,o_ret);
    return;
  case 0xc:
    pcVar6 = (char *)((ulong)&uStack_28 & 0xffffffff);
  case 0xe:
    *(char *)(unaff_RBP - 0x75) = *(char *)(unaff_RBP - 0x75) + (char)pcVar6;
    RStack_30.code = 0xa2;
    RStack_30.rA = 0xa4;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_RPTR_NUM(&ctx->ctx,o_mov,sDWORD,rEBP,shift_00,in_R9D);
    goto LAB_002aa5da;
  case 0xd:
    "void EMIT_OP_RPTR_NUM(CodeGenGenericContext &, x86Command, x86Size, x86Reg, int, x86Reg, unsigned int, unsigned int)"
    [lVar9 + 0x1a] =
         "void EMIT_OP_RPTR_NUM(CodeGenGenericContext &, x86Command, x86Size, x86Reg, int, x86Reg, unsigned int, unsigned int)"
         [lVar9 + 0x1a] + uVar4;
    cVar7 = (char)lVar10 + *(char *)&(ctx->ctx).x86Op;
    lVar9 = CONCAT71((int7)((ulong)lVar10 >> 8),cVar7);
    *pcVar6 = *pcVar6 + uVar4;
    pcVar1 = (char *)(lVar9 + -0x7d);
    *pcVar1 = *pcVar1 + uVar4;
    *(int *)&(ctx->ctx).x86Op = *(int *)&(ctx->ctx).x86Op + (int)lVar9;
    *pcVar6 = *pcVar6 + uVar4;
    pcVar6[-0x77] = pcVar6[-0x77] + cVar7;
    *(long *)((long)cmd + 0x4d) = (long)ROUND(in_ST0);
    RStack_30.code = 'M';
    RStack_30.rA = 0xa5;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_REG_REG(&ctx->ctx,xVar11,rESI,rR15);
    unaff_R15 = unaff_R15 + 4;
    RStack_30.code = 0x89;
    RStack_30.rA = 0xa5;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_REG_NUM(&ctx->ctx,o_add64,rESI,(uint)unaff_R13);
    RStack_30.code = 0xa9;
    RStack_30.rA = 0xa5;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_REG_RPTR(&ctx->ctx,o_lea,rEDI,sQWORD,rEBP,shift_00);
    RStack_30.code = 0xc0;
    RStack_30.rA = 0xa5;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rECX,(uint)(unaff_RBP >> 2) & 0x3fffffff);
    RStack_30.code = 0xcd;
    RStack_30.rA = 0xa5;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP(&ctx->ctx,o_rep_movsd);
    unaff_RBP = uStack_28 & 0xffffffff;
    unaff_R13 = &switchD_002aa3f2::switchdataD_0036623c;
    goto LAB_002aa5da;
  case 0xf:
    RStack_30.code = '\x1d';
    RStack_30.rA = 0xa4;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_REG_RPTR(&ctx->ctx,xVar11,0x366210,size,in_R8D,in_R9D);
    RStack_30.code = '=';
    RStack_30.rA = 0xa4;
    RStack_30.rB = '*';
    RStack_30.rC = '\0';
    RStack_30.argument = 0;
    EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBP,shift_00,rEAX);
    goto LAB_002aa5da;
  case 0x10:
    RStack_30 = cmd;
    (**(code **)(CONCAT71(cmd._1_7_ >> 8,uVar4 + '\f') + 0x4efff434))
              (ctx,xVar11 ^ (x86Command)&RStack_30,0x366211);
    return;
  case 0x11:
    (**(code **)&(ctx->ctx).genReg[0].ptrIndex)();
    return;
  case 0x12:
    do {
    } while( true );
  }
  RStack_30.code = '_';
  RStack_30.rA = 0x8f;
  RStack_30.rB = '*';
  RStack_30.rC = '\0';
  RStack_30.argument = 0;
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEDI,sQWORD,rEBX,(uint)((ulong)cmd >> 0x15) & 0x7f8);
  RStack_30.code = 't';
  RStack_30.rA = 0x8f;
  RStack_30.rB = '*';
  RStack_30.rC = '\0';
  RStack_30.argument = 0;
  EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rECX,cmd.argument);
  EMIT_OP(&ctx->ctx,xVar11);
  return;
}

Assistant:

void GenCodeCmdSetRange(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
#if defined(_M_X64)
	switch(RegVmSetRangeType(cmd.rB))
	{
	case rvsrDouble:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rREG, cmd.rA * 8); // Load double value as long
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosq);
		break;
	case rvsrFloat:
		EMIT_OP_REG_RPTR(ctx.ctx, o_cvtsd2ss, rXMM0, sQWORD, rREG, cmd.rA * 8); // Load double as float
		EMIT_OP_REG_REG(ctx.ctx, o_movd, rEAX, rXMM0); // Move to integer register
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosd);
		break;
	case rvsrLong:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rREG, cmd.rA * 8); // Load long value
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosq);
		break;
	case rvsrInt:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosd);
		break;
	case rvsrShort:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosw);
		break;
	case rvsrChar:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosb);
		break;
	default:
		assert(!"unknown type");
	}
#else
	switch(RegVmSetRangeType(cmd.rB))
	{
	case rvsrDouble:
	case rvsrLong:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8);
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDX, sDWORD, rREG, cmd.rA * 8 + 4);

		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, rECX, sDWORD, rEDI, cmd.argument * 8);

		EMIT_LABEL(ctx.ctx, ctx.labelCount);
		EMIT_OP_REG_REG(ctx.ctx, o_cmp, rEDI, rECX);
		EMIT_OP_LABEL(ctx.ctx, o_je, ctx.labelCount + 1, true);

		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rEDI, 0, rEAX);
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rEDI, 4, rEDX);

		EMIT_OP_REG_NUM(ctx.ctx, o_add, rEDI, 8);
		EMIT_REG_READ(ctx.ctx, rEDI); // Mark that register is used (by next iteration)

		EMIT_OP_LABEL(ctx.ctx, o_jmp, ctx.labelCount, true);
		EMIT_LABEL(ctx.ctx, ctx.labelCount + 1);

		ctx.labelCount += 2;
		break;
	case rvsrFloat:
		EMIT_OP_REG_RPTR(ctx.ctx, o_cvtsd2ss, rXMM0, sQWORD, rREG, cmd.rA * 8); // Load double as float
		EMIT_OP_REG_REG(ctx.ctx, o_movd, rEAX, rXMM0); // Move to integer register
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosd);
		break;
	case rvsrInt:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosd);
		break;
	case rvsrShort:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosw);
		break;
	case rvsrChar:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosb);
		break;
	default:
		assert(!"unknown type");
	}
#endif
}